

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffpsvc(char *card,char *value,char *comm,int *status)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  char cVar9;
  char *pcVar10;
  char strbuf [21];
  
  if (0 < *status) {
    return *status;
  }
  *value = '\0';
  if (comm != (char *)0x0) {
    *comm = '\0';
  }
  sVar3 = strlen(card);
  if (0x50 < sVar3) {
    strncpy(strbuf,card,0x14);
    strbuf[0x14] = '\0';
    ffpmsg("The card string starting with the chars below is too long:");
    ffpmsg(strbuf);
    *status = 0xcf;
    return 0xcf;
  }
  cVar9 = *card;
  iVar7 = (int)sVar3;
  if (cVar9 == 'H') {
    iVar1 = strncmp(card,"HIERARCH ",9);
    if (iVar1 != 0) {
      if (sVar3 < 9) goto LAB_0012ee9c;
      pcVar10 = "HISTORY ";
      goto LAB_0012ebdf;
    }
    sVar4 = strcspn(card,"=");
    if (sVar4 == sVar3) {
      if (8 < sVar3 && comm != (char *)0x0) {
        strcpy(comm,card + 8);
        for (uVar2 = iVar7 - 9; (-1 < (int)uVar2 && (comm[uVar2] == ' ')); uVar2 = uVar2 - 1) {
          comm[uVar2] = '\0';
        }
      }
      goto LAB_0012ee9c;
    }
LAB_0012ec53:
    lVar8 = sVar4 + 1;
  }
  else {
    if (sVar3 < 9) goto LAB_0012ee9c;
    if (cVar9 == ' ') {
      pcVar10 = "        ";
LAB_0012ebdf:
      iVar1 = strncmp(card,pcVar10,8);
      if (iVar1 == 0) {
LAB_0012ec9d:
        if (comm != (char *)0x0) {
          strcpy(comm,card + 8);
          for (uVar2 = iVar7 - 9; (-1 < (int)uVar2 && (comm[uVar2] == ' ')); uVar2 = uVar2 - 1) {
            comm[uVar2] = '\0';
          }
        }
        goto LAB_0012ee9c;
      }
    }
    else {
      if (cVar9 == 'E') {
        pcVar10 = "END     ";
        goto LAB_0012ebdf;
      }
      if (cVar9 == 'C') {
        iVar1 = strncmp(card,"COMMENT ",8);
        if (iVar1 != 0) {
          pcVar10 = "CONTINUE";
          goto LAB_0012ebdf;
        }
        goto LAB_0012ec9d;
      }
    }
    if ((card[8] != '=') || (card[9] != ' ')) {
      sVar4 = strcspn(card,"=");
      if (sVar4 == sVar3) {
        if (comm != (char *)0x0) {
          strcpy(comm,card + 8);
          for (uVar2 = iVar7 - 9; (-1 < (int)uVar2 && (comm[uVar2] == ' ')); uVar2 = uVar2 - 1) {
            comm[uVar2] = '\0';
          }
        }
        goto LAB_0012ee9c;
      }
      goto LAB_0012ec53;
    }
    lVar8 = 10;
  }
  sVar4 = strspn(card + lVar8," ");
  uVar5 = sVar4 + lVar8;
  if (uVar5 != sVar3) {
    cVar9 = card[uVar5];
    if (cVar9 == '\'') {
      *value = '\'';
      iVar7 = 1;
LAB_0012ed39:
      iVar1 = iVar7;
      uVar6 = uVar5 + 1;
      if ((uVar6 < sVar3) && (iVar1 < 0x46)) {
        cVar9 = card[uVar6];
        if (cVar9 != '\'') goto LAB_0012ed79;
        cVar9 = card[uVar5 + 2];
        value[iVar1] = '\'';
        if (cVar9 == '\'') goto code_r0x0012ed63;
      }
      if (iVar1 < 0x46 && uVar6 != sVar3) {
        value[(long)iVar1 + 1] = '\0';
        uVar6 = uVar5 + 2;
      }
      else {
        iVar7 = 0x45;
        if (iVar1 < 0x45) {
          iVar7 = iVar1;
        }
        (value + iVar7)[0] = '\'';
        (value + iVar7)[1] = '\0';
        ffpmsg("This keyword string value has no closing quote:");
        ffpmsg(card);
      }
    }
    else {
      pcVar10 = card + uVar5;
      if (cVar9 == '(') {
        sVar3 = strcspn(pcVar10,")");
        sVar4 = strlen(pcVar10);
        if ((0x45 < sVar3) || (sVar3 == sVar4)) {
          ffpmsg("This complex keyword value has no closing \')\' within range:");
          ffpmsg(card);
          *status = 0xcd;
          return 0xcd;
        }
        strncpy(value,pcVar10,sVar3 + 1);
        value[sVar3 + 1] = '\0';
        uVar6 = sVar3 + uVar5 + 1;
      }
      else if (cVar9 == '/') {
        uVar6 = uVar5 + 1;
      }
      else {
        sVar4 = strcspn(pcVar10," /");
        sVar3 = 0x46;
        if (sVar4 < 0x46) {
          sVar3 = sVar4;
        }
        strncpy(value,pcVar10,sVar3);
        value[sVar3] = '\0';
        uVar6 = sVar3 + uVar5;
      }
    }
    if (comm != (char *)0x0) {
      sVar3 = strspn(card + uVar6," ");
      uVar6 = sVar3 + uVar6;
      if (uVar6 < 0x50) {
        uVar5 = uVar6;
        if (card[uVar6] == '/') {
          uVar5 = uVar6 + 1;
          if (card[uVar6 + 1] == ' ') {
            uVar5 = uVar6 + 2;
          }
        }
        strncpy(comm,card + uVar5,0x48);
        comm[0x48] = '\0';
        sVar3 = strlen(comm);
        for (uVar5 = sVar3 & 0xffffffff; (0 < (int)uVar5 && (comm[uVar5 - 1] == ' '));
            uVar5 = uVar5 - 1) {
          comm[uVar5 - 1] = '\0';
        }
      }
    }
  }
LAB_0012ee9c:
  return *status;
code_r0x0012ed63:
  uVar5 = uVar5 + 2;
  iVar7 = 0x47;
  if (iVar1 < 0x45) {
    iVar1 = iVar1 + 1;
    cVar9 = card[uVar5];
    uVar6 = uVar5;
LAB_0012ed79:
    uVar5 = uVar6;
    value[iVar1] = cVar9;
    iVar7 = iVar1 + 1;
  }
  goto LAB_0012ed39;
}

Assistant:

int ffpsvc(char *card,    /* I - FITS header card (nominally 80 bytes long) */
           char *value,   /* O - value string parsed from the card */
           char *comm,    /* O - comment string parsed from the card */
           int *status)   /* IO - error status   */
/*
  ParSe the Value and Comment strings from the input header card string.
  If the card contains a quoted string value, the returned value string
  includes the enclosing quote characters.  If comm = NULL, don't return
  the comment string.
*/
{
    int jj;
    size_t ii, cardlen, nblank, valpos;
    char strbuf[21];

    if (*status > 0)
        return(*status);

    value[0] = '\0';
    if (comm)
        comm[0] = '\0';

    cardlen = strlen(card);
    if (cardlen >= FLEN_CARD)
    {
       strncpy(strbuf,card,20);
       strbuf[20]='\0';
       ffpmsg("The card string starting with the chars below is too long:");
       ffpmsg(strbuf); 
       return(*status = BAD_KEYCHAR);
    }

    /* support for ESO HIERARCH keywords; find the '=' */
    if (FSTRNCMP(card, "HIERARCH ", 9) == 0)
    {
      valpos = strcspn(card, "=");

      if (valpos == cardlen)   /* no value indicator ??? */
      {
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
            strcpy(comm, &card[8]);

            jj=cardlen - 8;
            for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
            {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
            }
          }
        }
        return(*status);  /* no value indicator */
      }
      valpos++;  /* point to the position after the '=' */
    }
    else if (cardlen < 9  ||
        FSTRNCMP(card, "COMMENT ", 8) == 0 ||  /* keywords with no value */
        FSTRNCMP(card, "HISTORY ", 8) == 0 ||
        FSTRNCMP(card, "END     ", 8) == 0 ||
        FSTRNCMP(card, "CONTINUE", 8) == 0 ||
        FSTRNCMP(card, "        ", 8) == 0 )
    {
        /*  no value, so the comment extends from cols 9 - 80  */
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
             strcpy(comm, &card[8]);

             jj=cardlen - 8;
             for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
             {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
             }
          }
        }
        return(*status);
    }
    else if (FSTRNCMP(&card[8], "= ", 2) == 0  )
    {
        /* normal keyword with '= ' in cols 9-10 */
        valpos = 10;  /* starting position of the value field */
    }
    else
    {
      valpos = strcspn(card, "=");

      if (valpos == cardlen)   /* no value indicator ??? */
      {
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
            strcpy(comm, &card[8]);

            jj=cardlen - 8;
            for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
            {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
            }
          }
        }
        return(*status);  /* no value indicator */
      }
      valpos++;  /* point to the position after the '=' */
    }

    nblank = strspn(&card[valpos], " "); /* find number of leading blanks */

    if (nblank + valpos == cardlen)
    {
      /* the absence of a value string is legal, and simply indicates
         that the keyword value is undefined.  Don't write an error
         message in this case.
      */
        return(*status);
    }

    ii = valpos + nblank;

    if (card[ii] == '/' )  /* slash indicates start of the comment */
    {
         ii++;
    }
    else if (card[ii] == '\'' )  /* is this a quoted string value? */
    {
        value[0] = card[ii];
        for (jj=1, ii++; ii < cardlen && jj < FLEN_VALUE-1; ii++, jj++)
        {
            if (card[ii] == '\'')  /*  is this the closing quote?  */
            {
                if (card[ii+1] == '\'')  /* 2 successive quotes? */ 
                {
                   value[jj] = card[ii];
                   ii++;  
                   jj++;
                }
                else
                {
                    value[jj] = card[ii];
                    break;   /* found the closing quote, so exit this loop  */
                }
            }
            if (jj < FLEN_VALUE-1)
               value[jj] = card[ii];  /* copy the next character to the output */
        }

        if (ii == cardlen || jj >= FLEN_VALUE-1)
        {
            jj = minvalue(jj, FLEN_VALUE-2);  /* don't exceed 70 char string length */
            value[jj] = '\'';  /*  close the bad value string  */
            value[jj+1] = '\0';  /*  terminate the bad value string  */
            ffpmsg("This keyword string value has no closing quote:");
            ffpmsg(card);
	    /*  May 2008 - modified to not fail on this minor error  */
/*            return(*status = NO_QUOTE);  */
        }
        else
        {
            value[jj+1] = '\0';  /*  terminate the good value string  */
            ii++;   /*  point to the character following the value  */
        }
    }
    else if (card[ii] == '(' )  /* is this a complex value? */
    {
        nblank = strcspn(&card[ii], ")" ); /* find closing ) */
        if (nblank == strlen( &card[ii] ) || nblank >= FLEN_VALUE-1 )
        {
            ffpmsg("This complex keyword value has no closing ')' within range:");
            ffpmsg(card);
            return(*status = NO_QUOTE);
        }

        nblank++;
        strncpy(value, &card[ii], nblank);
        value[nblank] = '\0';
        ii = ii + nblank;        
    }
    else   /*  an integer, floating point, or logical FITS value string  */
    {
        nblank = strcspn(&card[ii], " /");  /* find the end of the token */
        if (nblank >= FLEN_VALUE) /* This should not happen for correct input */
           nblank = FLEN_VALUE-1;
        strncpy(value, &card[ii], nblank);
        value[nblank] = '\0';
        ii = ii + nblank;
    }

    /*  now find the comment string, if any  */
    if (comm)
    {
      nblank = strspn(&card[ii], " ");  /*  find next non-space character  */
      ii = ii + nblank;

      if (ii < 80)
      {
        if (card[ii] == '/')   /*  ignore the slash separator  */
        {
            ii++;
            if (card[ii] == ' ')  /*  also ignore the following space  */
                ii++;
        }
        strncpy(comm, &card[ii],FLEN_COMMENT-1);  /*  copy the remaining characters  */
        comm[FLEN_COMMENT-1] = '\0';

        jj=strlen(comm);
        for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
        {
            if (comm[jj] == ' ')
                comm[jj] = '\0';
            else
                break;
        }
      }
    }
    return(*status);
}